

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

void __thiscall PSBTInput::FillSignatureData(PSBTInput *this,SignatureData *sigdata)

{
  _Base_ptr __args;
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__args_1;
  allocator_type *paVar8;
  long in_FS_OFFSET;
  allocator_type local_51;
  uint160 local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->final_script_sig).super_CScriptBase._size;
  uVar7 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar7 = uVar1;
  }
  if (uVar7 != 0) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(sigdata->scriptSig).super_CScriptBase,&(this->final_script_sig).super_CScriptBase);
    sigdata->complete = true;
  }
  if ((this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((sigdata->complete & 1U) == 0) {
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
      ::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                  *)&sigdata->signatures,
                 (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )&(this->partial_sigs)._M_t._M_impl.super__Rb_tree_header);
      uVar1 = (this->redeem_script).super_CScriptBase._size;
      uVar7 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar7 = uVar1;
      }
      if (uVar7 != 0) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(sigdata->redeem_script).super_CScriptBase,
                   &(this->redeem_script).super_CScriptBase);
      }
      uVar1 = (this->witness_script).super_CScriptBase._size;
      uVar7 = uVar1 - 0x1d;
      if (uVar1 < 0x1d) {
        uVar7 = uVar1;
      }
      __args_1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)uVar7;
      if (uVar7 != 0) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(sigdata->witness_script).super_CScriptBase,
                   &(this->witness_script).super_CScriptBase);
      }
      for (p_Var6 = (this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->hd_keypaths)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        CPubKey::GetID((CKeyID *)&local_50,(CPubKey *)(p_Var6 + 1));
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
        ::_M_emplace_unique<CKeyID,std::pair<CPubKey_const,KeyOriginInfo>const&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                    *)&sigdata->misc_pubkeys,(CKeyID *)&local_50,
                   (pair<const_CPubKey,_KeyOriginInfo> *)(p_Var6 + 1));
      }
      if ((this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&sigdata->taproot_key_path_sig,&this->m_tap_key_sig);
      }
      for (p_Var6 = (this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header
          ; p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        std::
        _Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::pair<XOnlyPubKey,uint256>const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->taproot_script_sigs,
                   (_Rb_tree<std::pair<XOnlyPubKey,uint256>,std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::pair<XOnlyPubKey,uint256>>,std::allocator<std::pair<std::pair<XOnlyPubKey,uint256>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)(p_Var6 + 1),(pair<XOnlyPubKey,_uint256> *)(p_Var6 + 3),__args_1);
      }
      bVar5 = base_blob<256U>::IsNull((base_blob<256U> *)&this->m_tap_internal_key);
      if (!bVar5) {
        uVar2 = *(undefined8 *)
                 (this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems;
        uVar3 = *(undefined8 *)
                 ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
        uVar4 = *(undefined8 *)
                 ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18)
        ;
        *(undefined8 *)
         ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
         0x10) = *(undefined8 *)
                  ((this->m_tap_internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10
                  );
        *(undefined8 *)
         ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems +
         0x18) = uVar4;
        *(undefined8 *)
         (sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems =
             uVar2;
        *(undefined8 *)
         ((sigdata->tr_spenddata).internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems + 8)
             = uVar3;
      }
      bVar5 = base_blob<256U>::IsNull(&(this->m_tap_merkle_root).super_base_blob<256U>);
      if (!bVar5) {
        uVar2 = *(undefined8 *)(this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems;
        uVar3 = *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 8)
        ;
        uVar4 = *(undefined8 *)
                 ((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18);
        *(undefined8 *)
         ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 0x10) =
             *(undefined8 *)((this->m_tap_merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10)
        ;
        *(undefined8 *)
         ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar4;
        *(undefined8 *)(sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems =
             uVar2;
        *(undefined8 *)
         ((sigdata->tr_spenddata).merkle_root.super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
      }
      for (p_Var6 = (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        std::
        _Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
        ::
        _M_emplace_unique<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const&,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>
                  ((_Rb_tree<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::_Select1st<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>,std::less<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>,std::allocator<std::pair<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>>
                    *)&(sigdata->tr_spenddata).scripts,
                   (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                   (p_Var6 + 1),
                   (set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)(p_Var6 + 2));
      }
      for (p_Var6 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header
          ; p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        __args = p_Var6 + 1;
        std::
        _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
        ::
        _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>const&>
                  ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                    *)&sigdata->taproot_misc_pubkeys,(XOnlyPubKey *)__args,
                   (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                    *)(p_Var6 + 2));
        Hash160<XOnlyPubKey>(&local_50,(XOnlyPubKey *)__args);
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
        ::_M_emplace_unique<uint160,XOnlyPubKey_const&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,XOnlyPubKey>,std::_Select1st<std::pair<CKeyID_const,XOnlyPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,XOnlyPubKey>>>
                    *)&sigdata->tap_pubkeys,&local_50,(XOnlyPubKey *)__args);
      }
      for (p_Var6 = (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ; (_Rb_tree_header *)p_Var6 !=
            &(this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        paVar8 = &local_51;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,
                   (uchar *)(p_Var6 + 1),(uchar *)((long)&p_Var6[1]._M_left + 4),&local_51);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->ripemd160_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_50,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6[1]._M_right,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
      }
      for (p_Var6 = (this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->sha256_preimages)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        paVar8 = &local_51;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,
                   (uchar *)(p_Var6 + 1),(uchar *)(p_Var6 + 2),&local_51);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->sha256_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_50,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var6 + 2),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
      }
      for (p_Var6 = (this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->hash160_preimages)._M_t._M_impl.super__Rb_tree_header
          ; p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        paVar8 = &local_51;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,
                   (uchar *)(p_Var6 + 1),(uchar *)((long)&p_Var6[1]._M_left + 4),&local_51);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->hash160_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_50,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6[1]._M_right,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
      }
      for (p_Var6 = (this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(this->hash256_preimages)._M_t._M_impl.super__Rb_tree_header
          ; p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        paVar8 = &local_51;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_50,
                   (uchar *)(p_Var6 + 1),(uchar *)(p_Var6 + 2),&local_51);
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                  ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                    *)&sigdata->hash256_preimages,
                   (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&local_50,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var6 + 2),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)paVar8);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
      }
    }
  }
  else {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator=(&(sigdata->scriptWitness).stack,&(this->final_script_witness).stack);
    sigdata->complete = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PSBTInput::FillSignatureData(SignatureData& sigdata) const
{
    if (!final_script_sig.empty()) {
        sigdata.scriptSig = final_script_sig;
        sigdata.complete = true;
    }
    if (!final_script_witness.IsNull()) {
        sigdata.scriptWitness = final_script_witness;
        sigdata.complete = true;
    }
    if (sigdata.complete) {
        return;
    }

    sigdata.signatures.insert(partial_sigs.begin(), partial_sigs.end());
    if (!redeem_script.empty()) {
        sigdata.redeem_script = redeem_script;
    }
    if (!witness_script.empty()) {
        sigdata.witness_script = witness_script;
    }
    for (const auto& key_pair : hd_keypaths) {
        sigdata.misc_pubkeys.emplace(key_pair.first.GetID(), key_pair);
    }
    if (!m_tap_key_sig.empty()) {
        sigdata.taproot_key_path_sig = m_tap_key_sig;
    }
    for (const auto& [pubkey_leaf, sig] : m_tap_script_sigs) {
        sigdata.taproot_script_sigs.emplace(pubkey_leaf, sig);
    }
    if (!m_tap_internal_key.IsNull()) {
        sigdata.tr_spenddata.internal_key = m_tap_internal_key;
    }
    if (!m_tap_merkle_root.IsNull()) {
        sigdata.tr_spenddata.merkle_root = m_tap_merkle_root;
    }
    for (const auto& [leaf_script, control_block] : m_tap_scripts) {
        sigdata.tr_spenddata.scripts.emplace(leaf_script, control_block);
    }
    for (const auto& [pubkey, leaf_origin] : m_tap_bip32_paths) {
        sigdata.taproot_misc_pubkeys.emplace(pubkey, leaf_origin);
        sigdata.tap_pubkeys.emplace(Hash160(pubkey), pubkey);
    }
    for (const auto& [hash, preimage] : ripemd160_preimages) {
        sigdata.ripemd160_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
    for (const auto& [hash, preimage] : sha256_preimages) {
        sigdata.sha256_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
    for (const auto& [hash, preimage] : hash160_preimages) {
        sigdata.hash160_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
    for (const auto& [hash, preimage] : hash256_preimages) {
        sigdata.hash256_preimages.emplace(std::vector<unsigned char>(hash.begin(), hash.end()), preimage);
    }
}